

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void __thiscall Z80::OpCode_Next_PIXELDN(Z80 *this)

{
  char *pcVar1;
  Z80Reg ZVar2;
  
  pcVar1 = lp;
  if (0 < DAT_0018e51c) {
    ZVar2 = GetRegister((char **)this);
    if (ZVar2 != Z80_HL) {
      lp = pcVar1;
    }
    EmitByte(0xed,true);
    EmitByte(0x93,false);
    return;
  }
  Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  return;
}

Assistant:

static void OpCode_Next_PIXELDN() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		char *oldLp = lp;
		if (Z80_HL != GetRegister(lp)) lp = oldLp;		// "eat" explicit HL argument
		EmitByte(0xED, true);
		EmitByte(0x93);
	}